

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,uchar **mem)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  size_t __n;
  Mat *this_00;
  
  clear(this);
  puVar2 = (uint *)*mem;
  while( true ) {
    uVar1 = *puVar2;
    *mem = (uchar *)(puVar2 + 1);
    if ((ulong)uVar1 == 0xffffff17) break;
    lVar3 = 0xffffa4fc - (ulong)uVar1;
    if ((int)uVar1 < -0x5b03) {
      uVar1 = puVar2[1];
      *mem = (uchar *)(puVar2 + 2);
      this_00 = (Mat *)((long)this + lVar3 * 0x40 + 0x18);
      Mat::create(this_00,uVar1,4,(Allocator *)0x0);
      __n = (long)(int)uVar1 << 2;
      memcpy(this_00->data,*mem,__n);
      uVar1 = (uint)lVar3;
    }
    else {
      this->params[(int)uVar1].field_1 =
           *(anon_union_4_2_947300a4_for_anon_struct_64_3_9ed89b7b_1 *)(puVar2 + 1);
      __n = 4;
    }
    puVar2 = (uint *)(*mem + __n);
    *mem = (uchar *)puVar2;
    this->params[(int)uVar1].loaded = 1;
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const unsigned char*& mem)
{
    clear();

    int id = *(int*)(mem);
    mem += 4;

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = *(int*)(mem);
            mem += 4;

            params[id].v.create(len);

            memcpy(params[id].v.data, mem, len * 4);
            mem += len * 4;
        }
        else
        {
            params[id].f = *(float*)(mem);
            mem += 4;
        }

        params[id].loaded = 1;

        id = *(int*)(mem);
        mem += 4;
    }

    return 0;
}